

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nl-reader.h
# Opt level: O2

int __thiscall
mp::internal::NLReader<mp::internal::TextReader<fmt::Locale>,_TestNLHandler3>::ReadOpCode
          (NLReader<mp::internal::TextReader<fmt::Locale>,_TestNLHandler3> *this)

{
  int opcode;
  int local_c;
  
  local_c = TextReader<fmt::Locale>::ReadUInt<int>(this->reader_);
  if (0x52 < local_c) {
    TextReader<fmt::Locale>::ReportError<int>(this->reader_,(CStringRef)0x21c0ce,&local_c);
  }
  TextReader<fmt::Locale>::ReadTillEndOfLine(this->reader_);
  return local_c;
}

Assistant:

int ReadOpCode() {
    int opcode = reader_.ReadUInt();
    if (opcode > internal::MAX_OPCODE)
      reader_.ReportError("invalid opcode {}", opcode);
    reader_.ReadTillEndOfLine();
    return opcode;
  }